

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void finalize_script_execute_command
               (Am_Object *script_window,Am_Object *undo_db,Am_Object *window,bool register_show)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *this;
  Am_Object match_command;
  Am_Object script_execute_command;
  Am_String name;
  
  pAVar2 = Am_Object::Get(script_window,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&script_execute_command,pAVar2);
  Am_Object::Get_Object(&match_command,(Am_Slot_Key)script_window,(ulong)Am_NAME_OBJECT);
  pAVar2 = Am_Object::Get(&match_command,0x169,0);
  Am_String::Am_String(&name,pAVar2);
  Am_Object::~Am_Object(&match_command);
  this = Am_Object::Set(&script_execute_command,0x150,&name,0);
  Am_Object::Set(this,Am_EXECUTE_SCRIPT_ON_NEW,false,0);
  if (register_show) {
    register_script_command(&script_execute_command,window,undo_db,&name);
  }
  pAVar2 = Am_Object::Get(&script_execute_command,Am_BEFORE_OR_AFTER_COMMAND,3);
  Am_Object::Am_Object(&match_command,pAVar2);
  bVar1 = Am_Object::Valid(&match_command);
  if (bVar1) {
    am_install_match_command(&match_command,&script_execute_command);
  }
  Am_Object::~Am_Object(&match_command);
  Am_String::~Am_String(&name);
  Am_Object::~Am_Object(&script_execute_command);
  return;
}

Assistant:

void
finalize_script_execute_command(Am_Object &script_window, Am_Object &undo_db,
                                Am_Object &window, bool register_show)
{
  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_String name = script_window.Get_Object(Am_NAME_OBJECT).Get(Am_VALUE);
  script_execute_command
      .Set(Am_LABEL, name)
      // accelerator of execute command set directly by invoke.cc
      // .Set(Am_ACCELERATOR, accel_char)
      .Set(Am_EXECUTE_SCRIPT_ON_NEW, false);
  if (register_show)
    register_script_command(script_execute_command, window, undo_db, name);

  Am_Object match_command = script_execute_command.Get(
      Am_BEFORE_OR_AFTER_COMMAND, Am_RETURN_ZERO_ON_ERROR);
  if (match_command.Valid())
    am_install_match_command(match_command, script_execute_command);
}